

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void api_wrapper_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle *pfVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle **ppfVar9;
  fdb_kvs_handle *handle;
  long lVar10;
  fdb_config *pfVar11;
  fdb_doc **ppfVar12;
  fdb_doc *pfVar13;
  char *ptr_handle;
  uint uVar14;
  char *unaff_RBP;
  fdb_encryption_key *pfVar15;
  fdb_doc *pfVar16;
  void **unaff_R12;
  ulong uVar17;
  fdb_iterator **doc_00;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  fdb_kvs_handle *pfVar18;
  fdb_doc **doc_01;
  fdb_iterator **ptr_iterator;
  char *pcVar19;
  fdb_kvs_handle **ptr_handle_00;
  char *pcVar20;
  bool bVar21;
  fdb_kvs_handle *db;
  void *value;
  size_t valuelen;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char keybuf [256];
  char temp [256];
  fdb_config fconfig;
  char bodybuf [256];
  fdb_kvs_handle *pfStack_1c9c8;
  fdb_file_handle *pfStack_1c9c0;
  void *pvStack_1c9b8;
  size_t asStack_1c9b0 [3];
  undefined4 uStack_1c998;
  undefined4 uStack_1c994;
  undefined4 uStack_1c990;
  undefined4 uStack_1c98c;
  undefined4 uStack_1c988;
  fdb_kvs_config fStack_1c980;
  timeval tStack_1c968;
  fdb_config fStack_1c958;
  char acStack_1c860 [256];
  char acStack_1c760 [256];
  char acStack_1c660 [264];
  fdb_config *pfStack_1c558;
  fdb_iterator **ppfStack_1c550;
  fdb_kvs_handle *pfStack_1c548;
  fdb_iterator **ppfStack_1c540;
  fdb_kvs_handle *pfStack_1c538;
  code *pcStack_1c530;
  fdb_iterator *pfStack_1c518;
  fdb_file_handle *pfStack_1c510;
  fdb_kvs_handle *pfStack_1c508;
  fdb_kvs_handle *pfStack_1c500;
  fdb_kvs_config fStack_1c4f8;
  timeval tStack_1c4e0;
  fdb_config fStack_1c4d0;
  fdb_iterator *apfStack_1c3d8 [32];
  fdb_config fStack_1c2d8;
  fdb_kvs_handle **ppfStack_1c1d0;
  fdb_iterator **ppfStack_1c1c8;
  fdb_iterator **ppfStack_1c1c0;
  fdb_kvs_handle *pfStack_1c1b8;
  fdb_iterator *pfStack_1c1a8;
  fdb_kvs_handle *pfStack_1c1a0;
  fdb_iterator **ppfStack_1c198;
  fdb_kvs_handle *pfStack_1c190;
  fdb_kvs_config fStack_1c188;
  fdb_kvs_handle *apfStack_1c170 [8];
  undefined1 auStack_1c130 [64];
  fdb_iterator *apfStack_1c0f0 [33];
  fdb_config fStack_1bfe8;
  fdb_iterator *apfStack_1bef0 [32];
  fdb_iterator *apfStack_1bdf0 [32];
  fdb_kvs_handle fStack_1bcf0;
  undefined8 auStack_1b8f0 [896];
  fdb_kvs_handle *apfStack_19cf0 [1025];
  fdb_doc **ppfStack_17ce8;
  char *pcStack_17ce0;
  long lStack_17cd8;
  fdb_doc *pfStack_17cd0;
  fdb_doc **ppfStack_17cc8;
  fdb_doc *pfStack_17cc0;
  fdb_doc *pfStack_17ca8;
  fdb_file_handle *pfStack_17ca0;
  long lStack_17c98;
  fdb_kvs_handle *pfStack_17c90;
  long lStack_17c88;
  long lStack_17c80;
  fdb_doc **ppfStack_17c78;
  long lStack_17c70;
  fdb_doc **ppfStack_17c68;
  size_t sStack_17c60;
  timeval tStack_17c58;
  fdb_kvs_config fStack_17c48;
  fdb_file_info fStack_17c30;
  fdb_doc afStack_17be8 [3];
  char acStack_17ae8 [264];
  fdb_config fStack_179e0;
  char acStack_178e8 [256];
  fdb_doc *apfStack_177e8 [2999];
  size_t sStack_11a30;
  size_t asStack_11a28 [1023];
  undefined1 auStack_fa29 [57225];
  fdb_doc **ppfStack_1aa0;
  fdb_config *pfStack_1a98;
  fdb_file_handle **ppfStack_1a90;
  ulong uStack_1a88;
  fdb_kvs_handle **ppfStack_1a80;
  fdb_kvs_handle **ppfStack_1a78;
  fdb_doc *pfStack_1a60;
  fdb_kvs_handle *pfStack_1a58;
  undefined1 auStack_1a50 [24];
  fdb_file_handle *pfStack_1a38;
  fdb_kvs_handle *pfStack_1a30;
  fdb_kvs_config fStack_1a28;
  fdb_doc *apfStack_1a10 [31];
  timeval tStack_1918;
  fdb_config fStack_1908;
  char acStack_1810 [256];
  fdb_file_handle *apfStack_1710 [32];
  char acStack_1610 [264];
  fdb_kvs_handle **ppfStack_1508;
  char *pcStack_1500;
  char *pcStack_14f8;
  ulong uStack_14f0;
  undefined8 uStack_14e8;
  code *pcStack_14e0;
  fdb_file_handle *pfStack_14d8;
  fdb_kvs_handle *pfStack_14d0;
  char acStack_14c8 [32];
  fdb_kvs_config fStack_14a8;
  timeval tStack_1490;
  fdb_file_info afStack_1480 [3];
  fdb_config fStack_1388;
  fdb_config *pfStack_1290;
  fdb_kvs_handle **ppfStack_1288;
  fdb_kvs_handle *pfStack_1280;
  fdb_doc *pfStack_1278;
  fdb_kvs_handle *pfStack_1270;
  fdb_encryption_key *pfStack_1268;
  fdb_kvs_handle *pfStack_1258;
  fdb_file_handle *pfStack_1250;
  undefined1 auStack_1248 [8];
  undefined1 auStack_1240 [48];
  fdb_kvs_handle *apfStack_1210 [32];
  fdb_doc afStack_1110 [3];
  fdb_config fStack_1010;
  ulong uStack_f18;
  fdb_kvs_handle **ppfStack_f10;
  fdb_kvs_handle *pfStack_f08;
  fdb_doc *pfStack_f00;
  fdb_kvs_handle *pfStack_ef8;
  fdb_encryption_key *pfStack_ef0;
  fdb_doc *pfStack_ee0;
  fdb_kvs_handle *pfStack_ed8;
  fdb_kvs_handle *pfStack_ed0;
  fdb_file_handle *pfStack_ec8;
  fdb_file_handle *pfStack_ec0;
  fdb_doc *apfStack_eb8 [11];
  fdb_kvs_config fStack_e60;
  timeval tStack_e48;
  fdb_kvs_handle fStack_e38;
  fdb_config fStack_b38;
  fdb_kvs_config *pfStack_a40;
  fdb_file_handle **ppfStack_a38;
  fdb_file_handle **ppfStack_a30;
  fdb_kvs_handle **ppfStack_a28;
  char *pcStack_a20;
  code *pcStack_a18;
  fdb_file_handle *pfStack_a00;
  fdb_kvs_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_file_handle *pfStack_9e8;
  fdb_doc *apfStack_9e0 [31];
  timeval tStack_8e8;
  fdb_kvs_config fStack_8d8;
  char acStack_8c0 [264];
  fdb_config fStack_7b8;
  char acStack_6c0 [256];
  char acStack_5c0 [264];
  fdb_kvs_handle *pfStack_4b8;
  void **ppvStack_4b0;
  fdb_kvs_handle *pfStack_4a8;
  fdb_kvs_handle *pfStack_4a0;
  fdb_kvs_handle **ppfStack_498;
  code *pcStack_490;
  fdb_kvs_handle *local_480;
  fdb_kvs_handle *local_478;
  void *local_470;
  fdb_kvs_handle *local_468;
  timeval local_460;
  undefined1 local_450 [280];
  char local_338 [264];
  fdb_config local_230;
  void *local_138 [33];
  
  pcStack_490 = (code *)0x11720e;
  gettimeofday(&local_460,(__timezone_ptr_t)0x0);
  pcStack_490 = (code *)0x117213;
  memleak_start();
  pcStack_490 = (code *)0x11721f;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_490 = (code *)0x11722f;
  fdb_get_default_config();
  pfVar18 = (fdb_kvs_handle *)local_450;
  pcStack_490 = (code *)0x11723c;
  fdb_get_default_kvs_config();
  local_230.buffercache_size = 0;
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.purging_interval = 0;
  local_230.compaction_threshold = '\0';
  pcVar19 = (char *)&local_468;
  pcStack_490 = (code *)0x117275;
  fdb_open((fdb_file_handle **)pcVar19,"./dummy1",&local_230);
  pfVar5 = (fdb_kvs_handle *)&local_480;
  pcStack_490 = (code *)0x117288;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_468,(fdb_kvs_handle **)pfVar5,(fdb_kvs_config *)pfVar18);
  pcStack_490 = (code *)0x11729e;
  fVar3 = fdb_set_log_callback(local_480,logCallbackFunc,"api_wrapper_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117506;
  pcStack_490 = (code *)0x1172b9;
  fVar3 = fdb_set_kv(local_480,(void *)0x0,0,(void *)0x0,0);
  if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011750b;
  pcVar20 = local_450 + 0x18;
  pcVar19 = "body%d";
  unaff_R12 = local_138;
  unaff_RBP = (char *)0x0;
  do {
    pcStack_490 = (code *)0x1172eb;
    sprintf(pcVar20,"key%d",unaff_RBP);
    pcStack_490 = (code *)0x1172fa;
    sprintf((char *)unaff_R12,"body%d",unaff_RBP);
    unaff_R13 = local_480;
    pcStack_490 = (code *)0x117307;
    pfVar5 = (fdb_kvs_handle *)strlen(pcVar20);
    pcStack_490 = (code *)0x117312;
    sVar6 = strlen((char *)unaff_R12);
    pcStack_490 = (code *)0x117326;
    fVar3 = fdb_set_kv(unaff_R13,pcVar20,(size_t)pfVar5,unaff_R12,sVar6);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_490 = (code *)0x1174ec;
      api_wrapper_test();
      goto LAB_001174ec;
    }
    uVar14 = (int)unaff_RBP + 1;
    unaff_RBP = (char *)(ulong)uVar14;
  } while (uVar14 != 10);
  pfVar5 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcStack_490 = (code *)0x117350;
  sprintf((char *)pfVar5,"key%d",5);
  pfVar18 = local_480;
  pcStack_490 = (code *)0x11735d;
  sVar6 = strlen((char *)pfVar5);
  pcStack_490 = (code *)0x11736b;
  fVar3 = fdb_del_kv(pfVar18,pfVar5,sVar6);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117510;
  pcStack_490 = (code *)0x117381;
  fVar3 = fdb_del_kv(local_480,(void *)0x0,0);
  if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00117515;
  pfVar18 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcVar19 = (char *)&local_478;
  unaff_R12 = &local_470;
  unaff_RBP = local_338;
  unaff_R13 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_490 = (code *)0x1173b8;
    sprintf((char *)pfVar18,"key%d",unaff_R13);
    pfVar5 = local_480;
    pcStack_490 = (code *)0x1173c5;
    sVar6 = strlen((char *)pfVar18);
    pcStack_490 = (code *)0x1173d9;
    fVar3 = fdb_get_kv(pfVar5,pfVar18,sVar6,(void **)pcVar19,(size_t *)unaff_R12);
    if ((int)unaff_R13 == 5) {
      if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00117501;
    }
    else {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001174fc;
      pcStack_490 = (code *)0x117405;
      sprintf(unaff_RBP,"body%d",unaff_R13);
      pfVar5 = local_478;
      pcStack_490 = (code *)0x11741a;
      iVar4 = bcmp(local_478,unaff_RBP,(size_t)local_470);
      if (iVar4 != 0) goto LAB_001174ec;
      pcStack_490 = (code *)0x11742a;
      fdb_free_block(pfVar5);
    }
    uVar14 = (int)unaff_R13 + 1;
    unaff_R13 = (fdb_kvs_handle *)(ulong)uVar14;
  } while (uVar14 != 10);
  pcStack_490 = (code *)0x11744f;
  fVar3 = fdb_get_kv(local_480,(void *)0x0,0,&local_478,(size_t *)&local_470);
  handle = local_480;
  if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011751a;
  pfVar18 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcStack_490 = (code *)0x11746a;
  sVar6 = strlen((char *)pfVar18);
  pcStack_490 = (code *)0x11747d;
  fVar3 = fdb_get_kv(handle,pfVar18,sVar6,(void **)0x0,(size_t *)0x0);
  if (fVar3 == FDB_RESULT_INVALID_ARGS) {
    pcStack_490 = (code *)0x117490;
    fdb_kvs_close(local_480);
    pcStack_490 = (code *)0x11749a;
    fdb_close((fdb_file_handle *)local_468);
    pcStack_490 = (code *)0x11749f;
    fdb_shutdown();
    pcStack_490 = (code *)0x1174a4;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (api_wrapper_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pcStack_490 = (code *)0x1174d5;
    fprintf(_stderr,pcVar19,"API wrapper test");
    return;
  }
  goto LAB_0011751f;
LAB_00118042:
  pfStack_ef0 = (fdb_encryption_key *)0x118052;
  flush_before_commit_multi_writers_test();
  pfVar13 = pfVar16;
  goto LAB_00118052;
LAB_00118398:
  pfStack_1268 = (fdb_encryption_key *)0x1183a5;
  auto_commit_test();
  pfVar18 = (fdb_kvs_handle *)pcVar19;
LAB_001183a5:
  pcVar19 = (char *)pfVar18;
  pfStack_1268 = (fdb_encryption_key *)0x1183aa;
  auto_commit_test();
LAB_001183aa:
  pfStack_1268 = (fdb_encryption_key *)0x1183b7;
  auto_commit_test();
  pfVar18 = (fdb_kvs_handle *)pcVar19;
LAB_001183b7:
  pfVar16 = afStack_1110;
  ppfVar9 = apfStack_1210;
  pfStack_1268 = (fdb_encryption_key *)0x1183bc;
  auto_commit_test();
  goto LAB_001183bc;
LAB_0011968a:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar5 = (fdb_kvs_handle *)pcVar20;
LAB_0011969e:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
LAB_001174ec:
  pcStack_490 = (code *)0x1174fc;
  api_wrapper_test();
LAB_001174fc:
  pcStack_490 = (code *)0x117501;
  api_wrapper_test();
LAB_00117501:
  pfVar18 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcStack_490 = (code *)0x117506;
  api_wrapper_test();
LAB_00117506:
  pcStack_490 = (code *)0x11750b;
  api_wrapper_test();
LAB_0011750b:
  pcStack_490 = (code *)0x117510;
  api_wrapper_test();
LAB_00117510:
  pcStack_490 = (code *)0x117515;
  api_wrapper_test();
LAB_00117515:
  pcStack_490 = (code *)0x11751a;
  api_wrapper_test();
LAB_0011751a:
  handle = pfVar5;
  pcStack_490 = (code *)0x11751f;
  api_wrapper_test();
LAB_0011751f:
  pcStack_490 = flush_before_commit_test;
  api_wrapper_test();
  pcStack_a18 = (code *)0x117544;
  pfStack_4b8 = handle;
  ppvStack_4b0 = unaff_R12;
  pfStack_4a8 = unaff_R13;
  pfStack_4a0 = pfVar18;
  ppfStack_498 = (fdb_kvs_handle **)pcVar19;
  pcStack_490 = (code *)unaff_RBP;
  gettimeofday(&tStack_8e8,(__timezone_ptr_t)0x0);
  pcStack_a18 = (code *)0x117549;
  memleak_start();
  pcStack_a18 = (code *)0x117555;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_a18 = (code *)0x117565;
  fdb_get_default_config();
  pcStack_a18 = (code *)0x117575;
  fdb_get_default_kvs_config();
  fStack_7b8.buffercache_size = 0;
  fStack_7b8.wal_threshold = 5;
  fStack_7b8.flags = 1;
  fStack_7b8.purging_interval = 0;
  fStack_7b8.compaction_threshold = '\0';
  fStack_7b8.wal_flush_before_commit = true;
  pcStack_a18 = (code *)0x1175b9;
  fdb_open(&pfStack_9e8,"dummy1",&fStack_7b8);
  pcStack_a18 = (code *)0x1175cc;
  fdb_open(&pfStack_a00,"dummy1",&fStack_7b8);
  pcStack_a18 = (code *)0x1175dd;
  fdb_kvs_open_default(pfStack_9e8,&pfStack_9f0,&fStack_8d8);
  pcStack_a18 = (code *)0x1175f1;
  fdb_kvs_open_default(pfStack_a00,&pfStack_9f8,&fStack_8d8);
  pcStack_a18 = (code *)0x117607;
  fVar3 = fdb_set_log_callback(pfStack_9f8,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar12 = apfStack_9e0;
    uVar17 = 0;
    do {
      pcStack_a18 = (code *)0x117633;
      sprintf(acStack_8c0,"key%d",uVar17 & 0xffffffff);
      pcStack_a18 = (code *)0x11764f;
      sprintf(acStack_5c0,"meta%d",uVar17 & 0xffffffff);
      pcStack_a18 = (code *)0x11766b;
      sprintf(acStack_6c0,"body%d",uVar17 & 0xffffffff);
      pcStack_a18 = (code *)0x117673;
      sVar6 = strlen(acStack_8c0);
      pcStack_a18 = (code *)0x11767e;
      sVar7 = strlen(acStack_5c0);
      pcStack_a18 = (code *)0x117689;
      sVar8 = strlen(acStack_6c0);
      pcStack_a18 = (code *)0x1176a9;
      fdb_doc_create(ppfVar12,acStack_8c0,sVar6,acStack_5c0,sVar7,acStack_6c0,sVar8);
      uVar17 = uVar17 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar17 != 0x1e);
    pcStack_a18 = (code *)0x1176c9;
    fdb_begin_transaction(pfStack_a00,'\x02');
    pcStack_a18 = (code *)0x1176d8;
    fdb_set(pfStack_9f0,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x1176e7;
    fdb_set(pfStack_9f0,apfStack_9e0[1]);
    lVar10 = 0;
    pcStack_a18 = (code *)0x1176f5;
    fdb_commit(pfStack_9e8,'\0');
    pcStack_a18 = (code *)0x117704;
    fdb_set(pfStack_9f8,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x117713;
    fdb_set(pfStack_9f8,apfStack_9e0[1]);
    pcStack_a18 = (code *)0x11771f;
    fdb_end_transaction(pfStack_a00,'\0');
    pcStack_a18 = (code *)0x11772e;
    fdb_commit(pfStack_9e8,'\x01');
    pcStack_a18 = (code *)0x11773d;
    fdb_begin_transaction(pfStack_a00,'\x02');
    pcStack_a18 = (code *)0x11774c;
    fdb_set(pfStack_9f8,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x11775b;
    fdb_set(pfStack_9f8,apfStack_9e0[1]);
    pcStack_a18 = (code *)0x117767;
    fdb_end_transaction(pfStack_a00,'\0');
    pcStack_a18 = (code *)0x117776;
    fdb_set(pfStack_9f0,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x117785;
    fdb_set(pfStack_9f0,apfStack_9e0[1]);
    pcStack_a18 = (code *)0x117791;
    fdb_commit(pfStack_9e8,'\0');
    pcStack_a18 = (code *)0x1177a0;
    fdb_commit(pfStack_9e8,'\x01');
    pcStack_a18 = (code *)0x1177af;
    fdb_begin_transaction(pfStack_a00,'\x02');
    pcStack_a18 = (code *)0x1177be;
    fdb_set(pfStack_9f8,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x1177cd;
    fdb_set(pfStack_9f8,apfStack_9e0[1]);
    pcStack_a18 = (code *)0x1177dc;
    fdb_set(pfStack_9f0,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x1177eb;
    fdb_set(pfStack_9f0,apfStack_9e0[1]);
    pcStack_a18 = (code *)0x1177f7;
    fdb_commit(pfStack_9e8,'\0');
    pcStack_a18 = (code *)0x117803;
    fdb_end_transaction(pfStack_a00,'\0');
    pcStack_a18 = (code *)0x117812;
    fdb_commit(pfStack_9e8,'\x01');
    pcStack_a18 = (code *)0x117821;
    fdb_begin_transaction(pfStack_a00,'\x02');
    pcStack_a18 = (code *)0x117830;
    fdb_set(pfStack_9f0,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x11783f;
    fdb_set(pfStack_9f0,apfStack_9e0[1]);
    pcStack_a18 = (code *)0x11784e;
    fdb_set(pfStack_9f8,apfStack_9e0[0]);
    pcStack_a18 = (code *)0x11785d;
    fdb_set(pfStack_9f8,apfStack_9e0[1]);
    pcStack_a18 = (code *)0x117869;
    fdb_end_transaction(pfStack_a00,'\0');
    pcStack_a18 = (code *)0x117875;
    fdb_commit(pfStack_9e8,'\0');
    pcStack_a18 = (code *)0x117884;
    fdb_commit(pfStack_9e8,'\x01');
    pcStack_a18 = (code *)0x117893;
    fdb_begin_transaction(pfStack_a00,'\x02');
    do {
      pcStack_a18 = (code *)0x1178a2;
      fdb_set(pfStack_9f8,apfStack_9e0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x1178bf;
      fdb_set(pfStack_9f0,apfStack_9e0[lVar10 + 10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    pcStack_a18 = (code *)0x1178d9;
    fdb_compact(pfStack_9e8,"dummy2");
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x1178ed;
      fdb_set(pfStack_9f8,apfStack_9e0[lVar10 + 0x14]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    lVar10 = 0;
    pcStack_a18 = (code *)0x117904;
    fdb_end_transaction(pfStack_a00,'\0');
    do {
      pcStack_a18 = (code *)0x117916;
      fdb_set(pfStack_9f0,apfStack_9e0[lVar10 + 0x19]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    pcStack_a18 = (code *)0x117929;
    fdb_close(pfStack_9e8);
    pcStack_a18 = (code *)0x117933;
    fdb_close(pfStack_a00);
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x11793f;
      fdb_doc_free(apfStack_9e0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1e);
    pcStack_a18 = (code *)0x11794d;
    fdb_shutdown();
    pcStack_a18 = (code *)0x117952;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pcStack_a18 = (code *)0x117983;
    fprintf(_stderr,pcVar19,"flush before commit test");
    return;
  }
  pcStack_a18 = flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_a20 = "dummy1";
  pfStack_ef0 = (fdb_encryption_key *)0x1179bd;
  pfStack_a40 = &fStack_8d8;
  ppfStack_a38 = &pfStack_9e8;
  ppfStack_a30 = &pfStack_a00;
  ppfStack_a28 = &pfStack_9f8;
  pcStack_a18 = (code *)unaff_RBP;
  gettimeofday(&tStack_e48,(__timezone_ptr_t)0x0);
  pfStack_ef0 = (fdb_encryption_key *)0x1179c2;
  memleak_start();
  pfStack_ee0 = (fdb_doc *)0x0;
  pfStack_ef0 = (fdb_encryption_key *)0x1179d3;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_ef0 = (fdb_encryption_key *)0x1179e3;
  fdb_get_default_config();
  fStack_b38.buffercache_size = 0;
  fStack_b38.wal_threshold = 8;
  fStack_b38.flags = 1;
  fStack_b38.purging_interval = 0;
  fStack_b38.compaction_threshold = '\0';
  fStack_b38.wal_flush_before_commit = true;
  pfStack_ef0 = (fdb_encryption_key *)0x117a15;
  fdb_get_default_kvs_config();
  pfStack_ef0 = (fdb_encryption_key *)0x117a2c;
  fdb_open(&pfStack_ec8,"dummy1",&fStack_b38);
  pfStack_ef0 = (fdb_encryption_key *)0x117a3e;
  fdb_kvs_open(pfStack_ec8,&pfStack_ed8,(char *)0x0,&fStack_e60);
  lVar10 = 0;
  uVar17 = 0;
  do {
    ppfVar9 = &fStack_e38.bub_ctx.handle;
    pfStack_ef0 = (fdb_encryption_key *)0x117a5e;
    sprintf((char *)ppfVar9,"key%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117a76;
    sprintf((char *)&fStack_e38.config.encryption_key,"meta%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117a8e;
    sprintf((char *)&fStack_e38,"body%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117a9e;
    sVar6 = strlen((char *)ppfVar9);
    pfVar15 = &fStack_e38.config.encryption_key;
    pfStack_ef0 = (fdb_encryption_key *)0x117ab1;
    sVar7 = strlen((char *)pfVar15);
    pfStack_ef0 = (fdb_encryption_key *)0x117ac1;
    sVar8 = strlen((char *)&fStack_e38);
    pfStack_ef0 = (fdb_encryption_key *)0x117ae6;
    fdb_doc_create((fdb_doc **)((long)apfStack_eb8 + lVar10),&fStack_e38.bub_ctx.handle,sVar6,
                   pfVar15,sVar7,&fStack_e38,sVar8);
    pfStack_ef0 = (fdb_encryption_key *)0x117af5;
    fdb_set(pfStack_ed8,apfStack_eb8[uVar17]);
    uVar17 = uVar17 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar17 != 10);
  pfStack_ef0 = (fdb_encryption_key *)0x117b15;
  fdb_commit(pfStack_ec8,'\x01');
  pfStack_ef0 = (fdb_encryption_key *)0x117b31;
  fdb_open(&pfStack_ec0,"dummy1",&fStack_b38);
  pfStack_ef0 = (fdb_encryption_key *)0x117b48;
  fdb_kvs_open(pfStack_ec0,&pfStack_ed0,(char *)0x0,&fStack_e60);
  pfVar15 = &fStack_e38.config.encryption_key;
  lVar10 = 0;
  uVar17 = 0;
  do {
    pfStack_ef0 = (fdb_encryption_key *)0x117b71;
    sprintf((char *)pfVar15,"meta2%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117b85;
    sprintf((char *)&fStack_e38,"body2%d(db2)",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117b95;
    sVar6 = strlen((char *)pfVar15);
    pfStack_ef0 = (fdb_encryption_key *)0x117ba0;
    sVar7 = strlen((char *)&fStack_e38);
    pfStack_ef0 = (fdb_encryption_key *)0x117bb4;
    fdb_doc_update((fdb_doc **)((long)apfStack_eb8 + lVar10),pfVar15,sVar6,&fStack_e38,sVar7);
    pfStack_ef0 = (fdb_encryption_key *)0x117bc3;
    fdb_set(pfStack_ed0,apfStack_eb8[uVar17]);
    uVar17 = uVar17 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar17 != 5);
  uVar17 = 5;
  lVar10 = 0x28;
  pfVar15 = &fStack_e38.config.encryption_key;
  pfVar5 = &fStack_e38;
  do {
    pfStack_ef0 = (fdb_encryption_key *)0x117c05;
    sprintf((char *)pfVar15,"meta2%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117c14;
    sprintf((char *)pfVar5,"body2%d(db1)",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117c24;
    sVar6 = strlen((char *)pfVar15);
    pfStack_ef0 = (fdb_encryption_key *)0x117c2f;
    sVar7 = strlen((char *)pfVar5);
    pfStack_ef0 = (fdb_encryption_key *)0x117c4a;
    fdb_doc_update((fdb_doc **)((long)apfStack_eb8 + lVar10),pfVar15,sVar6,pfVar5,sVar7);
    pfStack_ef0 = (fdb_encryption_key *)0x117c59;
    fdb_set(pfStack_ed8,apfStack_eb8[uVar17]);
    uVar17 = uVar17 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar17 != 10);
  ppfVar9 = &fStack_e38.bub_ctx.handle;
  pfVar15 = &fStack_e38.config.encryption_key;
  uVar17 = 0;
  do {
    pcVar19 = "body2%d(db1)";
    pfStack_ef0 = (fdb_encryption_key *)0x117c93;
    sprintf((char *)ppfVar9,"key%d",uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117ca6;
    sprintf((char *)pfVar15,"meta2%d",uVar17);
    if ((uint)uVar17 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_ef0 = (fdb_encryption_key *)0x117cc3;
    sprintf((char *)&fStack_e38,pcVar19,uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117ccb;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117ceb;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117cfa;
    fVar3 = fdb_get(pfStack_ed8,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00118008:
      pfStack_ef0 = (fdb_encryption_key *)0x11800d;
      flush_before_commit_multi_writers_test();
LAB_0011800d:
      pfStack_ef0 = (fdb_encryption_key *)0x118012;
      flush_before_commit_multi_writers_test();
      pfVar16 = (fdb_doc *)pcVar19;
LAB_00118012:
      pfStack_ef0 = (fdb_encryption_key *)0x118022;
      flush_before_commit_multi_writers_test();
LAB_00118022:
      pfStack_ef0 = (fdb_encryption_key *)0x118032;
      flush_before_commit_multi_writers_test();
LAB_00118032:
      pfStack_ef0 = (fdb_encryption_key *)0x118042;
      flush_before_commit_multi_writers_test();
      goto LAB_00118042;
    }
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117d1a;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) {
      pfStack_ef0 = (fdb_encryption_key *)0x118008;
      flush_before_commit_multi_writers_test();
      pcVar19 = (char *)pfVar16;
      goto LAB_00118008;
    }
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117d35;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00118012;
    pfStack_ef0 = (fdb_encryption_key *)0x117d45;
    fdb_doc_free(pfVar16);
    pcVar19 = (char *)0x0;
    pfStack_ee0 = (fdb_doc *)0x0;
    pfStack_ef0 = (fdb_encryption_key *)0x117d55;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117d71;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117d80;
    fVar3 = fdb_get(pfStack_ed0,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011800d;
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117da0;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) goto LAB_00118032;
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117dbb;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00118022;
    pfStack_ef0 = (fdb_encryption_key *)0x117dcb;
    fdb_doc_free(pfVar16);
    pfStack_ee0 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar17 + 1;
    uVar17 = (ulong)uVar14;
  } while (uVar14 != 10);
  pfStack_ef0 = (fdb_encryption_key *)0x117df2;
  fdb_commit(pfStack_ec8,'\0');
  pfStack_ef0 = (fdb_encryption_key *)0x117dfe;
  fdb_commit(pfStack_ec0,'\0');
  ppfVar9 = &fStack_e38.bub_ctx.handle;
  pfVar15 = &fStack_e38.config.encryption_key;
  uVar17 = 0;
  while( true ) {
    pfStack_ef0 = (fdb_encryption_key *)0x117e32;
    sprintf((char *)ppfVar9,"key%d",uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117e45;
    sprintf((char *)pfVar15,"meta2%d",uVar17);
    pcVar19 = "body2%d(db1)";
    if ((uint)uVar17 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_ef0 = (fdb_encryption_key *)0x117e5f;
    sprintf((char *)&fStack_e38,pcVar19,uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117e67;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117e87;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117e96;
    fVar3 = fdb_get(pfStack_ed8,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    pfVar13 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117eb6;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) goto LAB_00118042;
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117ed1;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_0011805c;
    pfStack_ef0 = (fdb_encryption_key *)0x117ee1;
    fdb_doc_free(pfVar16);
    pfVar13 = (fdb_doc *)0x0;
    pfStack_ee0 = (fdb_doc *)0x0;
    pfStack_ef0 = (fdb_encryption_key *)0x117ef1;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117f0d;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117f1c;
    fVar3 = fdb_get(pfStack_ed0,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118057;
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117f3c;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) goto LAB_0011807c;
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117f57;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_0011806c;
    pfStack_ef0 = (fdb_encryption_key *)0x117f67;
    fdb_doc_free(pfVar16);
    pfStack_ee0 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar17 + 1;
    uVar17 = (ulong)uVar14;
    if (uVar14 == 10) {
      pfStack_ef0 = (fdb_encryption_key *)0x117f8c;
      fdb_close(pfStack_ec8);
      pfStack_ef0 = (fdb_encryption_key *)0x117f96;
      fdb_close(pfStack_ec0);
      lVar10 = 0;
      do {
        pfStack_ef0 = (fdb_encryption_key *)0x117fa2;
        fdb_doc_free(apfStack_eb8[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 10);
      pfStack_ef0 = (fdb_encryption_key *)0x117fb0;
      fdb_shutdown();
      pfStack_ef0 = (fdb_encryption_key *)0x117fb5;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_ef0 = (fdb_encryption_key *)0x117fe6;
      fprintf(_stderr,pcVar19,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00118052:
  pfStack_ef0 = (fdb_encryption_key *)0x118057;
  flush_before_commit_multi_writers_test();
LAB_00118057:
  pfStack_ef0 = (fdb_encryption_key *)0x11805c;
  flush_before_commit_multi_writers_test();
  pfVar16 = pfVar13;
LAB_0011805c:
  pfStack_ef0 = (fdb_encryption_key *)0x11806c;
  flush_before_commit_multi_writers_test();
LAB_0011806c:
  pfStack_ef0 = (fdb_encryption_key *)0x11807c;
  flush_before_commit_multi_writers_test();
LAB_0011807c:
  pfVar18 = &fStack_e38;
  ppfVar9 = &fStack_e38.bub_ctx.handle;
  pfVar15 = &fStack_e38.config.encryption_key;
  pfStack_ef0 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_1268 = (fdb_encryption_key *)0x1180a9;
  uStack_f18 = uVar17;
  ppfStack_f10 = ppfVar9;
  pfStack_f08 = pfVar5;
  pfStack_f00 = pfVar16;
  pfStack_ef8 = pfVar18;
  pfStack_ef0 = pfVar15;
  gettimeofday((timeval *)(auStack_1240 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_1268 = (fdb_encryption_key *)0x1180ae;
  memleak_start();
  pfStack_1268 = (fdb_encryption_key *)0x1180ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_1010;
  pfStack_1268 = (fdb_encryption_key *)0x1180ca;
  fdb_get_default_config();
  pfStack_1268 = (fdb_encryption_key *)0x1180d4;
  fdb_get_default_kvs_config();
  fStack_1010.buffercache_size = 0;
  fStack_1010.wal_threshold = 0x1000;
  fStack_1010.flags = 1;
  fStack_1010.durability_opt = '\x02';
  fStack_1010.auto_commit = true;
  pfStack_1268 = (fdb_encryption_key *)0x118107;
  fVar3 = fdb_open(&pfStack_1250,"dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1268 = (fdb_encryption_key *)0x118123;
    fVar3 = fdb_kvs_open_default(pfStack_1250,&pfStack_1258,(fdb_kvs_config *)(auStack_1240 + 8));
    pcVar19 = (char *)pfVar18;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c1;
    pcVar19 = "body%d";
    pfVar15 = (fdb_encryption_key *)0x0;
    do {
      pfStack_1268 = (fdb_encryption_key *)0x118154;
      sprintf((char *)afStack_1110,"key%d",pfVar15);
      pfStack_1268 = (fdb_encryption_key *)0x118163;
      sprintf((char *)apfStack_1210,"body%d",pfVar15);
      pfVar5 = pfStack_1258;
      pfStack_1268 = (fdb_encryption_key *)0x118170;
      sVar6 = strlen((char *)afStack_1110);
      pfVar11 = (fdb_config *)(sVar6 + 1);
      pfStack_1268 = (fdb_encryption_key *)0x11817c;
      sVar6 = strlen((char *)apfStack_1210);
      pfStack_1268 = (fdb_encryption_key *)0x118191;
      fVar3 = fdb_set_kv(pfVar5,afStack_1110,(size_t)pfVar11,apfStack_1210,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1268 = (fdb_encryption_key *)0x118398;
        auto_commit_test();
        goto LAB_00118398;
      }
      uVar14 = (int)pfVar15 + 1;
      pfVar15 = (fdb_encryption_key *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfVar16 = afStack_1110;
    ppfVar9 = apfStack_1210;
    pfVar5 = (fdb_kvs_handle *)auStack_1240;
    pfVar15 = (fdb_encryption_key *)auStack_1248;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_1268 = (fdb_encryption_key *)0x1181cf;
      sprintf((char *)pfVar16,"key%d",pfVar11);
      pfStack_1268 = (fdb_encryption_key *)0x1181e2;
      sprintf((char *)ppfVar9,"body%d",pfVar11);
      pfVar18 = pfStack_1258;
      pfStack_1268 = (fdb_encryption_key *)0x1181ef;
      sVar6 = strlen((char *)pfVar16);
      pfStack_1268 = (fdb_encryption_key *)0x118204;
      fVar3 = fdb_get_kv(pfVar18,pfVar16,sVar6 + 1,(void **)pfVar5,(size_t *)pfVar15);
      pcVar19 = (char *)auStack_1240._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183a5;
      pfStack_1268 = (fdb_encryption_key *)0x118221;
      iVar4 = bcmp((void *)auStack_1240._0_8_,ppfVar9,(size_t)auStack_1248);
      if (iVar4 != 0) goto LAB_00118398;
      pfStack_1268 = (fdb_encryption_key *)0x118231;
      fdb_free_block(pcVar19);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_1268 = (fdb_encryption_key *)0x118245;
    fVar3 = fdb_kvs_close(pfStack_1258);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c6;
    pfStack_1268 = (fdb_encryption_key *)0x118257;
    fVar3 = fdb_close(pfStack_1250);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183cb;
    pfStack_1268 = (fdb_encryption_key *)0x118278;
    fVar3 = fdb_open(&pfStack_1250,"dummy1",&fStack_1010);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d0;
    pfStack_1268 = (fdb_encryption_key *)0x118294;
    fVar3 = fdb_kvs_open_default(pfStack_1250,&pfStack_1258,(fdb_kvs_config *)(auStack_1240 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d5;
    pfVar16 = afStack_1110;
    ppfVar9 = apfStack_1210;
    pfVar5 = (fdb_kvs_handle *)auStack_1240;
    pfVar15 = (fdb_encryption_key *)auStack_1248;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_1268 = (fdb_encryption_key *)0x1182c8;
      sprintf((char *)pfVar16,"key%d",pfVar11);
      pfStack_1268 = (fdb_encryption_key *)0x1182db;
      sprintf((char *)ppfVar9,"body%d",pfVar11);
      pfVar18 = pfStack_1258;
      pfStack_1268 = (fdb_encryption_key *)0x1182e8;
      sVar6 = strlen((char *)pfVar16);
      pfStack_1268 = (fdb_encryption_key *)0x1182fd;
      fVar3 = fdb_get_kv(pfVar18,pfVar16,sVar6 + 1,(void **)pfVar5,(size_t *)pfVar15);
      pcVar19 = (char *)auStack_1240._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183b7;
      pfStack_1268 = (fdb_encryption_key *)0x11831a;
      iVar4 = bcmp((void *)auStack_1240._0_8_,ppfVar9,(size_t)auStack_1248);
      if (iVar4 != 0) goto LAB_001183aa;
      pfStack_1268 = (fdb_encryption_key *)0x11832a;
      fdb_free_block(pcVar19);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_1268 = (fdb_encryption_key *)0x11833e;
    fVar3 = fdb_close(pfStack_1250);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_1268 = (fdb_encryption_key *)0x11834b;
      fdb_shutdown();
      pfStack_1268 = (fdb_encryption_key *)0x118350;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1268 = (fdb_encryption_key *)0x118381;
      fprintf(_stderr,pcVar19,"auto commit test");
      return;
    }
  }
  else {
LAB_001183bc:
    pfStack_1268 = (fdb_encryption_key *)0x1183c1;
    auto_commit_test();
    pcVar19 = (char *)pfVar18;
LAB_001183c1:
    pfStack_1268 = (fdb_encryption_key *)0x1183c6;
    auto_commit_test();
LAB_001183c6:
    pfStack_1268 = (fdb_encryption_key *)0x1183cb;
    auto_commit_test();
LAB_001183cb:
    pfStack_1268 = (fdb_encryption_key *)0x1183d0;
    auto_commit_test();
LAB_001183d0:
    pfStack_1268 = (fdb_encryption_key *)0x1183d5;
    auto_commit_test();
LAB_001183d5:
    pfStack_1268 = (fdb_encryption_key *)0x1183da;
    auto_commit_test();
  }
  pfStack_1268 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_14e0 = (code *)0x1183fc;
  pfStack_1290 = pfVar11;
  ppfStack_1288 = ppfVar9;
  pfStack_1280 = pfVar5;
  pfStack_1278 = pfVar16;
  pfStack_1270 = (fdb_kvs_handle *)pcVar19;
  pfStack_1268 = pfVar15;
  gettimeofday(&tStack_1490,(__timezone_ptr_t)0x0);
  pcStack_14e0 = (code *)0x118401;
  memleak_start();
  pcStack_14e0 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_14e0 = (code *)0x11841d;
  fdb_get_default_config();
  fStack_1388.buffercache_size = 0;
  fStack_1388.auto_commit = true;
  pcStack_14e0 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_14e0 = (code *)0x118446;
  memcpy(&fStack_1388,afStack_1480,0xf8);
  pcStack_14e0 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar17 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_14c8 + 8,"est1",5);
    builtin_strncpy(acStack_14c8,"./func_t",8);
    pcStack_14e0 = (code *)0x11849b;
    fVar3 = fdb_open(&pfStack_14d8,acStack_14c8,&fStack_1388);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_14e0 = (code *)0x1184b7;
    fVar3 = fdb_kvs_open(pfStack_14d8,&pfStack_14d0,"justonekv",&fStack_14a8);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_14e0 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_14e0 = (code *)0x1184cd;
    fVar3 = fdb_get_file_info(pfStack_14d8,afStack_1480);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (afStack_1480[0].file_size != fStack_1388.blocksize * 7) {
      pcStack_14e0 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_14e0 = (code *)0x1184f8;
    fVar3 = fdb_close(pfStack_14d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar14 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar14;
    if (uVar14 == 0) {
      pcStack_14e0 = (code *)0x118523;
      fdb_shutdown();
      pcStack_14e0 = (code *)0x118528;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_14e0 = (code *)0x118559;
      fprintf(_stderr,pcVar19,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_14e0 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_14e0 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_14e0 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_14e8 = 0x745f636e75662f2e;
  pcStack_14f8 = "justonekv";
  ppfStack_1a78 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_1508 = &pfStack_14d0;
  pcStack_1500 = acStack_14c8;
  uStack_14f0 = uVar17;
  pcStack_14e0 = (code *)&pfStack_14d8;
  gettimeofday(&tStack_1918,(__timezone_ptr_t)0x0);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_1a60 = (fdb_doc *)0x0;
  ppfStack_1a78 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_1a78 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_1a78 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_1908.buffercache_size = 0;
  fStack_1908.flags = 1;
  fStack_1908.purging_interval = 0;
  fStack_1908.compaction_threshold = '\0';
  ppfStack_1a78 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
             &fStack_1a28);
  ppfVar12 = apfStack_1a10;
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_1810,"key%d",uVar17 & 0xffffffff);
    ppfStack_1a78 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_1610,"meta%d",uVar17 & 0xffffffff);
    ptr_fhandle = apfStack_1710;
    ppfStack_1a78 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar17 & 0xffffffff);
    ppfStack_1a78 = (fdb_kvs_handle **)0x1186a1;
    ppfVar9 = (fdb_kvs_handle **)strlen(acStack_1810);
    ppfStack_1a78 = (fdb_kvs_handle **)0x1186ac;
    sVar6 = strlen(acStack_1610);
    ppfStack_1a78 = (fdb_kvs_handle **)0x1186b7;
    sVar7 = strlen((char *)ptr_fhandle);
    ppfStack_1a78 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar12,acStack_1810,(size_t)ppfVar9,acStack_1610,sVar6,ptr_fhandle,sVar7);
    uVar17 = uVar17 + 1;
    ppfVar12 = ppfVar12 + 1;
  } while (uVar17 != 0x1e);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_1a58,apfStack_1a10[0]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_1a58,apfStack_1a10[1]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar11 = &fStack_1908;
  ppfStack_1a78 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
             &fStack_1a28);
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17]->key,apfStack_1a10[uVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if (uVar17 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_1a78 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_1a58,apfStack_1a10[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar11 = &fStack_1908;
  ppfStack_1a78 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
             &fStack_1a28);
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17]->key,apfStack_1a10[uVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if ((uVar17 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_1a78 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_1a78 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 6);
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_1a58,apfStack_1a10[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[lVar10 + 6]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_1a38,"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_1a38,&pfStack_1a30,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_1a38,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_1a30,apfStack_1a10[lVar10 + 8]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_1a38,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_1a38);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17]->key,apfStack_1a10[uVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if ((int)uVar17 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_1a78 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 10);
  pfVar11 = (fdb_config *)auStack_1a50;
  ppfStack_1a78 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar11,"dummy1",&fStack_1908);
  ptr_fhandle = &pfStack_1a38;
  ppfStack_1a78 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_1908);
  ptr_handle_00 = (fdb_kvs_handle **)(auStack_1a50 + 8);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._0_8_,ptr_handle_00,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_1a38,&pfStack_1a30,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  ppfVar9 = &pfStack_1a58;
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_1a58,apfStack_1a10[10]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_1a58,apfStack_1a10[0xb]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[0xc]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[0xd]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_1a38,'\x02');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_1a30,apfStack_1a10[0xe]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_1a30,apfStack_1a10[0xf]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_1a58,apfStack_1a10[0x10]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_1a38,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_1a58,apfStack_1a10[0x11]);
  uVar17 = 0;
  ppfStack_1a78 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\0');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_1a38);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,ppfVar9,&fStack_1a28);
  while( true ) {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17 + 10]->key,apfStack_1a10[uVar17 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_1a78 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
    if (uVar17 == 8) {
      ppfStack_1a78 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",&fStack_1908);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
                 &fStack_1a28);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
      ppfStack_1a78 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[0x14]);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_1a50._16_8_,"dummy2");
      ppfStack_1a78 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x01');
      ppfStack_1a78 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
      lVar10 = 0;
      do {
        ppfStack_1a78 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_1a10[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1e);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_1a78 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      ppfStack_1a78 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar19,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_1a78 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_17cc0 = (fdb_doc *)0x118dba;
  ppfStack_1aa0 = &pfStack_1a60;
  pfStack_1a98 = pfVar11;
  ppfStack_1a90 = ptr_fhandle;
  uStack_1a88 = uVar17;
  ppfStack_1a80 = ptr_handle_00;
  ppfStack_1a78 = ppfVar9;
  gettimeofday(&tStack_17c58,(__timezone_ptr_t)0x0);
  pfStack_17cc0 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_17ca8 = (fdb_doc *)0x0;
  pfStack_17cc0 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_17cc0 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_17cc0 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_179e0.flags = 1;
  fStack_179e0.purging_interval = 0;
  fStack_179e0.compaction_threshold = '\0';
  fStack_179e0.durability_opt = '\x02';
  pfStack_17cc0 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_17ca0,"dummy1",&fStack_179e0);
  pfStack_17cc0 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_17ca0,&pfStack_17c90,&fStack_17c48);
  ppfVar12 = apfStack_177e8;
  pfVar16 = afStack_17be8;
  pfVar13 = (fdb_doc *)0x0;
  lVar10 = 0;
  do {
    sVar6 = 0xff7f;
    if (lVar10 == 1) {
      sVar6 = 0x1fff;
    }
    if (lVar10 == 0) {
      sVar6 = 0x7fff;
    }
    pfStack_17cc0 = (fdb_doc *)0x118e7c;
    lStack_17c88 = lVar10;
    memset(asStack_11a28,0x5f,sVar6);
    *(undefined1 *)((long)asStack_11a28 + sVar6) = 0;
    lVar10 = 0;
    doc_01 = ppfVar12;
    lStack_17c80 = (long)pfVar13;
    ppfStack_17c78 = ppfVar12;
    sStack_17c60 = sVar6;
    do {
      pfStack_17cc0 = (fdb_doc *)0x118eb2;
      lStack_17c70 = lVar10;
      sprintf((char *)pfVar16,"%08d");
      asStack_11a28[0] = afStack_17be8[0].keylen;
      uVar17 = 0;
      lStack_17c98 = (long)pfVar13;
      ppfStack_17c68 = doc_01;
      do {
        pfStack_17cc0 = (fdb_doc *)0x118eee;
        sprintf((char *)pfVar16,"%08d",uVar17 & 0xffffffff);
        *(size_t *)((long)apfStack_177e8 + sStack_17c60 + 0x5db8) = afStack_17be8[0].keylen;
        uVar14 = (int)lStack_17c98 + (int)uVar17;
        pfStack_17cc0 = (fdb_doc *)0x118f27;
        sprintf(acStack_178e8,"meta%d",(ulong)uVar14);
        pfStack_17cc0 = (fdb_doc *)0x118f3a;
        sprintf(acStack_17ae8,"body%d",(ulong)uVar14);
        pfStack_17cc0 = (fdb_doc *)0x118f47;
        sVar6 = strlen((char *)asStack_11a28);
        pfStack_17cc0 = (fdb_doc *)0x118f53;
        sVar7 = strlen(acStack_178e8);
        pfStack_17cc0 = (fdb_doc *)0x118f67;
        sVar8 = strlen(acStack_17ae8);
        lVar1 = lStack_17c98;
        pcVar19 = acStack_17ae8;
        pfStack_17cc0 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_01,asStack_11a28,sVar6 + 1,acStack_178e8,sVar7 + 1,pcVar19,sVar8 + 1);
        uVar17 = uVar17 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar17 != 10);
      lVar10 = lStack_17c70 + 1;
      doc_01 = ppfStack_17c68 + 10;
      pfVar13 = (fdb_doc *)(lVar1 + 10);
    } while (lVar10 != 100);
    lVar10 = lStack_17c88 + 1;
    ppfVar12 = ppfStack_17c78 + 1000;
    pfVar13 = (fdb_doc *)(lStack_17c80 + 1000);
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pfStack_17cc0 = (fdb_doc *)0x119010;
    fdb_set(pfStack_17c90,apfStack_177e8[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3000);
  pfStack_17cc0 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_17ca0,'\x01');
  pfStack_17cc0 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_17ca0,&fStack_17c30);
  if (fStack_17c30.doc_count != 3000) {
    pfStack_17cc0 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar10 = 0;
  while( true ) {
    pfStack_17cc0 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_17ca8,apfStack_177e8[lVar10]->key,apfStack_177e8[lVar10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_17cc0 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_17c90,pfStack_17ca8);
    doc = pfStack_17ca8;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_17ca8->key;
    pfVar16 = apfStack_177e8[lVar10];
    pcVar19 = (char *)pfVar16->key;
    pfStack_17cc0 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_01,pcVar19,pfStack_17ca8->keylen);
    pfVar13 = doc;
    if (iVar4 != 0) {
      pfStack_17cc0 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar19 = (char *)pfVar16->meta;
    pfStack_17cc0 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_01,pcVar19,doc->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_01 = (fdb_doc **)doc->body;
    pcVar19 = (char *)pfVar16->body;
    pfStack_17cc0 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_01,pcVar19,doc->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_17cc0 = (fdb_doc *)0x11910e;
    fdb_doc_free(doc);
    pfStack_17ca8 = (fdb_doc *)0x0;
    lVar10 = lVar10 + 1;
    if (lVar10 == 3000) {
      pfStack_17cc0 = (fdb_doc *)0x119131;
      fdb_close(pfStack_17ca0);
      lVar10 = 0;
      do {
        pfStack_17cc0 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_177e8[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3000);
      pfStack_17cc0 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_17cc0 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_17cc0 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar19,"long key test");
      return;
    }
  }
  pfStack_17cc0 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_17cc0 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_17cc0 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1191df;
  ppfStack_17ce8 = &pfStack_17ca8;
  pcStack_17ce0 = pcVar19;
  lStack_17cd8 = lVar10;
  pfStack_17cd0 = pfVar13;
  ppfStack_17cc8 = doc_01;
  pfStack_17cc0 = pfVar16;
  gettimeofday((timeval *)(auStack_1c130 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1c1b8 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1bfe8.wal_threshold = 0x400;
  fStack_1bfe8.compaction_mode = '\0';
  fStack_1bfe8.durability_opt = '\x02';
  pcVar20 = (char *)&fStack_1bcf0;
  doc_00 = apfStack_1bef0;
  pcVar19 = "kvs%d";
  uVar17 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc_00,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle = (char *)(apfStack_1c170 + (long)ptr_iterator);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)doc_00,&fStack_1bfe8);
    pfVar5 = (fdb_kvs_handle *)pcVar20;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1c198 = ptr_iterator;
    pfStack_1c190 = (fdb_kvs_handle *)pcVar20;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc_00,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar17));
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)pcVar20,(char *)doc_00,&fStack_1c188);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1c1b8 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      pcVar20 = (char *)&(((fdb_kvs_handle *)pcVar20)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1c198 + 1);
    uVar17 = uVar17 + 0x80;
    pcVar20 = (char *)&pfStack_1c190[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1c0f0;
  doc_00 = apfStack_1bdf0;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    uVar17 = 0;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar17);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc_00,"value%08d",uVar17);
      pcVar19 = *(char **)(&fStack_1bcf0.kvs_config.create_if_missing + (long)pfVar5 * 8);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119323;
      sVar6 = strlen((char *)ptr_iterator);
      ptr_handle = (char *)(sVar6 + 1);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11932f;
      sVar6 = strlen((char *)doc_00);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar19,ptr_iterator,(size_t)ptr_handle,doc_00,sVar6 + 1)
      ;
      pcVar20 = (char *)pfVar5;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar14 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c170[(long)ptr_handle],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c170[(long)ptr_handle],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  doc_00 = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_19cf0;
  ptr_iterator = (fdb_iterator **)(auStack_1c130 + 8);
  pfVar5 = (fdb_kvs_handle *)auStack_1c130;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1b8f0[(long)doc_00],(fdb_kvs_info *)pfVar5);
    if ((fdb_custom_cmp_variable)auStack_1c130._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1b8f0[(long)doc_00],
                              (fdb_kvs_handle **)ptr_handle,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc_00 = doc_00 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (doc_00 < (fdb_iterator **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1c170[(long)ptr_handle],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1c1a0;
  pfStack_1c1a0 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1c1a8;
  pcVar20 = "key%08d";
  doc_00 = apfStack_1c0f0;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_19cf0[(long)pfVar5],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar17 = 0;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1c1a8,(fdb_doc **)ptr_handle);
      pcVar19 = (char *)pfVar5;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc_00,"key%08d",uVar17);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc_00,(char *)pfStack_1c1a0->op_stats);
      if (iVar4 != 0) {
        pfStack_1c1b8 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1c1a8);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1c1a8);
    pcVar19 = (char *)&(pfVar5->config).wal_threshold;
    bVar21 = pfVar5 < (fdb_kvs_handle *)0x380;
    pfVar5 = (fdb_kvs_handle *)pcVar19;
  } while (bVar21);
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1c1a0);
  ptr_handle = "key%08d";
  ptr_iterator = apfStack_1c0f0;
  doc_00 = (fdb_iterator **)0x0;
  do {
    uVar17 = 0;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar17);
      pcVar20 = *(char **)(&fStack_1bcf0.kvs_config.create_if_missing + (long)doc_00 * 8);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119529;
      sVar6 = strlen((char *)ptr_iterator);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar20,ptr_iterator,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar14 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar14;
    } while (uVar14 != 10);
    doc_00 = (fdb_iterator **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_iterator **)0x400);
  ptr_handle = "dummy_compact%d";
  ptr_iterator = apfStack_1bef0;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar5 & 0xffffffff);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1c170[(long)pfVar5],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1c1a0;
  pfStack_1c1a0 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1c1a8;
  pcVar20 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1bcf0.kvs_config.create_if_missing + (long)pcVar20 * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar5 = (fdb_kvs_handle *)pcVar20;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1c1a8,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1c1a8);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1c1a8);
    pfVar5 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar20)->config).wal_threshold;
    bVar21 = pcVar20 < (fdb_kvs_handle *)0x380;
    pcVar20 = (char *)pfVar5;
  } while (bVar21);
  pfStack_1c1b8 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1c1a0);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1c170[(long)ptr_handle]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar19,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1c1b8 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1c530 = (code *)0x1196e0;
  ppfStack_1c1d0 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1c1c8 = doc_00;
  ppfStack_1c1c0 = ptr_iterator;
  pfStack_1c1b8 = pfVar5;
  gettimeofday(&tStack_1c4e0,(__timezone_ptr_t)0x0);
  pcStack_1c530 = (code *)0x1196e5;
  memleak_start();
  pcStack_1c530 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_1c4d0;
  pcStack_1c530 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1c530 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1c530 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1c510,"./dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1c530 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1c510,&pfStack_1c508,"db",&fStack_1c4f8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1c530 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1c510,&pfStack_1c500,"db2",&fStack_1c4f8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar11 = &fStack_1c2d8;
    pcStack_1c530 = (code *)0x119785;
    sprintf((char *)pfVar11,"key%d",0);
    ptr_iterator = apfStack_1c3d8;
    pcStack_1c530 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1c530 = (code *)0x1197a8;
    pfVar5 = (fdb_kvs_handle *)strlen((char *)pfVar11);
    pcStack_1c530 = (code *)0x1197b3;
    sVar6 = strlen((char *)ptr_iterator);
    doc_00 = &pfStack_1c518;
    pcStack_1c530 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc_00,pfVar11,(size_t)pfVar5,(void *)0x0,0,ptr_iterator,sVar6 + 1);
    pcStack_1c530 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1c508,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1c530 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1c510,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1c530 = (code *)0x11981b;
    sprintf((char *)pfStack_1c518->tree_cursor_prev,"bOdy%d",0);
    pcStack_1c530 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1c500,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1c530 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1c510,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1c530 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1c508,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1c530 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1c500,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1c530 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1c508,(fdb_doc *)pfStack_1c518);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1c530 = (code *)0x119899;
      fdb_close(pfStack_1c510);
      pcStack_1c530 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1c518);
      pcStack_1c530 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1c530 = (code *)0x1198ad;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_1c530 = (code *)0x1198de;
      fprintf(_stderr,pcVar19,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1c530 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1c530 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1c530 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1c530 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1c530 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1c530 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1c530 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1c530 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1c530 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1c530 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1c558 = pfVar11;
  ppfStack_1c550 = doc_00;
  pfStack_1c548 = (fdb_kvs_handle *)pcVar19;
  ppfStack_1c540 = ptr_iterator;
  pfStack_1c538 = pfVar5;
  pcStack_1c530 = (code *)uVar17;
  gettimeofday(&tStack_1c968,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1c958.wal_threshold = 0x400;
  fStack_1c958.flags = 1;
  fStack_1c958.purging_interval = 0;
  fStack_1c958.compaction_threshold = '\0';
  fStack_1c958.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1c958.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1c9c0,"./dummy1",&fStack_1c958);
  fdb_kvs_open_default(pfStack_1c9c0,&pfStack_1c9c8,&fStack_1c980);
  fVar3 = fdb_set_log_callback(pfStack_1c9c8,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1c9c8,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar17 = 0;
    do {
      sprintf(acStack_1c760,"key%d",uVar17);
      sprintf(acStack_1c660,"body%d",uVar17);
      pfVar5 = pfStack_1c9c8;
      sVar6 = strlen(acStack_1c760);
      sVar7 = strlen(acStack_1c660);
      fVar3 = fdb_set_kv(pfVar5,acStack_1c760,sVar6,acStack_1c660,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar14 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar14;
    } while (uVar14 != 10);
    asStack_1c9b0[1] = 0x726162ffffffff;
    asStack_1c9b0[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1c998 = 0xbdbdbdbd;
    uStack_1c994 = 0xbdbdbdbd;
    uStack_1c990 = 0xbdbdbdbd;
    uStack_1c98c = 0xbdbdbdbd;
    uStack_1c988 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1c9c0,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1c9c8);
    fdb_close(pfStack_1c9c0);
    fStack_1c958.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1c958.encryption_key.bytes,"bar",4);
    fStack_1c958.encryption_key.bytes[4] = 0xbd;
    fStack_1c958.encryption_key.bytes[5] = 0xbd;
    fStack_1c958.encryption_key.bytes[6] = 0xbd;
    fStack_1c958.encryption_key.bytes[7] = 0xbd;
    fStack_1c958.encryption_key.bytes[8] = 0xbd;
    fStack_1c958.encryption_key.bytes[9] = 0xbd;
    fStack_1c958.encryption_key.bytes[10] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xb] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xc] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xd] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xe] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xf] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x10] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x11] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x12] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x13] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x14] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x15] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x16] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x17] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x18] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x19] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1c9c0,"./dummy1",&fStack_1c958);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1c9c0,&pfStack_1c9c8,&fStack_1c980);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1c9c8,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar17 = 0;
      while( true ) {
        sprintf(acStack_1c760,"key%d",uVar17);
        pfVar5 = pfStack_1c9c8;
        sVar6 = strlen(acStack_1c760);
        fVar3 = fdb_get_kv(pfVar5,acStack_1c760,sVar6,&pvStack_1c9b8,asStack_1c9b0);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1c860,"body%d",uVar17);
        ptr = pvStack_1c9b8;
        iVar4 = bcmp(pvStack_1c9b8,acStack_1c860,asStack_1c9b0[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar14 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar14;
        if (uVar14 == 10) {
          fdb_kvs_close(pfStack_1c9c8);
          fdb_close(pfStack_1c9c0);
          fdb_shutdown();
          memleak_end();
          pcVar19 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar19 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar19,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
}

Assistant:

void api_wrapper_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char keybuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_set_kv(db, NULL, 0, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // remove key5
    sprintf(keybuf, "key%d", 5);
    status = fdb_del_kv(db, keybuf, strlen(keybuf));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_del_kv(db, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(temp, "body%d", i);
            TEST_CMP(value, temp, valuelen);
            fdb_free_block(value);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
    }

    // error check
    status = fdb_get_kv(db, NULL, 0, &value, &valuelen);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), NULL, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("API wrapper test");
}